

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

SBuf * lj_strfmt_putfchar(SBuf *sb,SFormat sf,int32_t c)

{
  uint uVar1;
  char *pcVar2;
  MSize sz;
  uint uVar3;
  
  uVar3 = sf >> 0x10 & 0xff;
  sz = uVar3 + (uVar3 == 0);
  uVar1 = (sb->p).ptr32;
  pcVar2 = (char *)(ulong)uVar1;
  if ((sb->e).ptr32 - uVar1 < sz) {
    pcVar2 = lj_buf_more2(sb,sz);
  }
  if ((sf >> 8 & 1) == 0) goto LAB_0011783c;
  *pcVar2 = (char)c;
  while( true ) {
    pcVar2 = pcVar2 + 1;
LAB_0011783c:
    if (uVar3 < 2) break;
    uVar3 = uVar3 - 1;
    *pcVar2 = ' ';
  }
  if ((sf >> 8 & 1) == 0) {
    *pcVar2 = (char)c;
    pcVar2 = pcVar2 + 1;
  }
  (sb->p).ptr32 = (uint32_t)pcVar2;
  return sb;
}

Assistant:

SBuf *lj_strfmt_putfchar(SBuf *sb, SFormat sf, int32_t c)
{
  MSize width = STRFMT_WIDTH(sf);
  char *p = lj_buf_more(sb, width > 1 ? width : 1);
  if ((sf & STRFMT_F_LEFT)) *p++ = (char)c;
  while (width-- > 1) *p++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) *p++ = (char)c;
  setsbufP(sb, p);
  return sb;
}